

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O3

void capnp::_::anon_unknown_0::verifyClient(Client *client,int *callCount,WaitScope *waitScope)

{
  int iVar1;
  WirePointer *pWVar2;
  undefined8 uVar3;
  Disposer *pDVar4;
  long *plVar5;
  RequestHook *pRVar6;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  bool bVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  Reader RVar11;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_108;
  Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> local_c8;
  void *local_b0;
  short local_a4;
  undefined4 local_a0;
  undefined8 *local_98;
  long *local_90;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_80;
  ArrayPtr<const_char> local_48;
  Maybe<capnp::MessageSize> local_38;
  
  iVar1 = *callCount;
  local_38.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest(&local_80,client,&local_38);
  *(undefined4 *)local_80.super_Builder._builder.data = 0x7b;
  *(byte *)((long)local_80.super_Builder._builder.data + 4) =
       *(byte *)((long)local_80.super_Builder._builder.data + 4) | 1;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_108,(int)&local_80,__buf,in_RCX,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            (&local_c8,&local_108);
  pDVar4 = local_108.hook.disposer;
  uVar3 = local_108.super_Builder._builder._32_8_;
  if (local_108.super_Builder._builder._32_8_ != 0) {
    local_108.super_Builder._builder.dataSize = 0;
    local_108.super_Builder._builder.pointerCount = 0;
    local_108.super_Builder._builder._38_2_ = 0;
    local_108.hook.disposer = (Disposer *)0x0;
    (**(local_108.hook.ptr)->_vptr_RequestHook)(local_108.hook.ptr,uVar3,8,pDVar4,pDVar4,0);
  }
  pWVar2 = local_108.super_Builder._builder.pointers;
  if (local_108.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_108.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_108.super_Builder._builder.data)
              (local_108.super_Builder._builder.data,
               (long)&(pWVar2->offsetAndKind).value + *(long *)((long)*pWVar2 + -0x10));
  }
  if (local_108.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_108.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_108.super_Builder._builder.segment._4_4_,
                         (int)local_108.super_Builder._builder.segment))();
  }
  bVar7 = local_a4 == 0;
  local_108.super_Builder._builder.data = local_b0;
  if (bVar7) {
    local_108.super_Builder._builder.data = (void *)0x0;
  }
  uVar9 = 0x7fffffff;
  if (!bVar7) {
    uVar9 = local_a0;
  }
  local_108.super_Builder._builder.segment._0_4_ = 0;
  local_108.super_Builder._builder.segment._4_4_ = 0;
  uVar8 = 0;
  uVar10 = 0;
  if (!bVar7) {
    local_108.super_Builder._builder.segment._0_4_ = (int)local_c8.super_PromiseBase.node.disposer;
    local_108.super_Builder._builder.segment._4_4_ = local_c8.super_PromiseBase.node.disposer._4_4_;
    uVar8 = local_c8.super_PromiseBase.node.ptr._0_4_;
    uVar10 = local_c8.super_PromiseBase.node.ptr._4_4_;
  }
  local_108.super_Builder._builder.capTable = (CapTableBuilder *)CONCAT44(uVar10,uVar8);
  local_108.super_Builder._builder.pointers._0_4_ = uVar9;
  RVar11 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_108,(void *)0x0,0);
  if (RVar11.super_StringPtr.content.size_ == 4) {
    if (((char)RVar11.super_StringPtr.content.ptr[1] != 'o' ||
        *RVar11.super_StringPtr.content.ptr != 0x6f66) && kj::_::Debug::minSeverity < 3)
    goto LAB_00288ba4;
  }
  else {
    if (2 < kj::_::Debug::minSeverity) goto LAB_00288c63;
LAB_00288ba4:
    bVar7 = local_a4 == 0;
    local_108.super_Builder._builder.data = local_b0;
    if (bVar7) {
      local_108.super_Builder._builder.data = (void *)0x0;
    }
    local_108.super_Builder._builder.pointers._0_4_ = 0x7fffffff;
    if (!bVar7) {
      local_108.super_Builder._builder.pointers._0_4_ = local_a0;
    }
    local_108.super_Builder._builder.segment._0_4_ = 0;
    local_108.super_Builder._builder.segment._4_4_ = 0;
    uVar9 = 0;
    uVar8 = 0;
    if (!bVar7) {
      local_108.super_Builder._builder.segment._0_4_ = (int)local_c8.super_PromiseBase.node.disposer
      ;
      local_108.super_Builder._builder.segment._4_4_ =
           local_c8.super_PromiseBase.node.disposer._4_4_;
      uVar9 = local_c8.super_PromiseBase.node.ptr._0_4_;
      uVar8 = local_c8.super_PromiseBase.node.ptr._4_4_;
    }
    local_108.super_Builder._builder.capTable = (CapTableBuilder *)CONCAT44(uVar8,uVar9);
    local_48 = (ArrayPtr<const_char>)
               PointerReader::getBlob<capnp::Text>((PointerReader *)&local_108,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[46],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2ab,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (response.getX())\", \"foo\", response.getX()"
               ,(char (*) [46])"failed: expected (\"foo\") == (response.getX())",
               (char (*) [4])0x4da3ec,(Reader *)&local_48);
  }
  if ((iVar1 + 1 != *callCount) && (kj::_::Debug::minSeverity < 3)) {
    local_108.super_Builder._builder.segment._0_4_ = iVar1 + 1;
    kj::_::Debug::log<char_const(&)[48],int,int_const&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2ac,ERROR,
               "\"failed: expected \" \"(origCount + 1) == (callCount)\", origCount + 1, callCount",
               (char (*) [48])"failed: expected (origCount + 1) == (callCount)",(int *)&local_108,
               callCount);
  }
LAB_00288c63:
  plVar5 = local_90;
  if (local_90 != (long *)0x0) {
    local_90 = (long *)0x0;
    (**(code **)*local_98)(local_98,(long)plVar5 + *(long *)(*plVar5 + -0x10));
  }
  pRVar6 = local_80.hook.ptr;
  if (local_80.hook.ptr != (RequestHook *)0x0) {
    local_80.hook.ptr = (RequestHook *)0x0;
    (**(local_80.hook.disposer)->_vptr_Disposer)
              (local_80.hook.disposer,
               pRVar6->_vptr_RequestHook[-2] + (long)&pRVar6->_vptr_RequestHook);
  }
  return;
}

Assistant:

void verifyClient(test::TestInterface::Client client, const int& callCount,
                  kj::WaitScope& waitScope) {
  int origCount = callCount;
  auto request = client.fooRequest();
  request.setI(123);
  request.setJ(true);
  auto response = request.send().wait(waitScope);
  EXPECT_EQ("foo", response.getX());
  EXPECT_EQ(origCount + 1, callCount);
}